

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
::value_init<phmap::priv::map_slot_type<std::__cxx11::string,std::__cxx11::string>*>
          (btree_node<phmap::priv::map_params<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,256,false>>
           *this,size_type i,allocator_type *alloc,
          map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          **args)

{
  if (((ulong)this & 7) == 0) {
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(this + i * 0x40 + 0x10),
           (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(alloc->
              super_CountingAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ).bytes_used_);
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<std::basic_string<char>, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<std::basic_string<char>, std::basic_string<char>, std::less<std::basic_string<char>>, phmap::priv::(anonymous namespace)::PropagatingCountingAlloc<std::pair<const std::basic_string<char>, std::basic_string<char>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

CopyConst<Char, ElementType<N>>* Pointer(Char* p) const {
        using C = typename std::remove_const<Char>::type;
        static_assert(
            std::is_same<C, char>() || std::is_same<C, unsigned char>() ||
            std::is_same<C, signed char>(),
            "The argument must be a pointer to [const] [signed|unsigned] char");
        constexpr size_t alignment = Alignment();
        (void)alignment;
        assert(reinterpret_cast<uintptr_t>(p) % alignment == 0);
        return reinterpret_cast<CopyConst<Char, ElementType<N>>*>(p + Offset<N>());
    }